

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeDOFTorqueDynEqFixedBase(BerdyHelper *this,DOFIndex idx)

{
  TraversalIndex TVar1;
  long in_RDI;
  IndexRange IVar2;
  TraversalIndex trvIdx;
  IndexRange ret;
  Traversal *in_stack_ffffffffffffffc8;
  Model *in_stack_ffffffffffffffd0;
  
  if (*(int *)(in_RDI + 0x1b0) == 0) {
    TVar1 = getTraversalIndexFromJointIndex
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_RDI);
    IVar2.size = 1;
    IVar2.offset = (TVar1 + -1) * 0x13 + 0x12;
  }
  else {
    IVar2 = (IndexRange)iDynTree::IndexRange::InvalidRange();
  }
  return IVar2;
}

Assistant:

IndexRange BerdyHelper::getRangeDOFTorqueDynEqFixedBase(const DOFIndex idx) const
{
    IndexRange ret;

    if( m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE )
    {
        TraversalIndex trvIdx = getTraversalIndexFromJointIndex(m_model,m_dynamicsTraversal,idx);
        ret.offset = 19*(trvIdx-1)+18;
        ret.size = 1;
        return ret;
    }

    return IndexRange::InvalidRange();
}